

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O1

int lws_token_from_index(lws *wsi,int index,char **arg,int *len,uint32_t *hdr_len)

{
  lws_h2_netconn *plVar1;
  char *__s;
  lws *wsi_00;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  
  uVar3 = 0xffff;
  if (index != 0xffff) {
    wsi_00 = lws_get_network_wsi(wsi);
    plVar1 = (wsi_00->h2).h2n;
    uVar3 = 0xffffffff;
    if ((plVar1 != (lws_h2_netconn *)0x0) && (-1 < index)) {
      if (index < 0x3e) {
        if (index < 0x11 && arg != (char **)0x0) {
          __s = http2_canned[(uint)index];
          *arg = __s;
          sVar2 = strlen(__s);
          *len = (int)sVar2;
        }
        if (hdr_len != (uint32_t *)0x0) {
          *hdr_len = (uint)""[(uint)index];
        }
        uVar3 = (uint)""[(uint)index];
      }
      else if (index < (int)((plVar1->hpack_dyn_table).used_entries + 0x3e)) {
        uVar3 = (uint)(plVar1->hpack_dyn_table).num_entries;
        iVar5 = (int)(((uint)(plVar1->hpack_dyn_table).pos - index) + 0x3d) % (int)uVar3;
        lVar4 = (long)(int)((iVar5 >> 0x1f & uVar3) + iVar5);
        _lws_log(0x40,"%s: dyn index %d, tok %d\n","lws_token_from_index",lVar4,
                 (ulong)(plVar1->hpack_dyn_table).entries[lVar4].lws_hdr_idx);
        if (len != (int *)0x0 && arg != (char **)0x0) {
          *arg = (plVar1->hpack_dyn_table).entries[lVar4].value;
          *len = (uint)(plVar1->hpack_dyn_table).entries[lVar4].value_len;
        }
        if (hdr_len != (uint32_t *)0x0) {
          *hdr_len = (uint)(plVar1->hpack_dyn_table).entries[lVar4].hdr_len;
        }
        uVar3 = (uint)(plVar1->hpack_dyn_table).entries[lVar4].lws_hdr_idx;
      }
      else {
        _lws_log(8,"  %s: adjusted index %d >= %d\n","lws_token_from_index",(ulong)(uint)index);
        lws_h2_goaway(wsi_00,9,"index out of range");
      }
    }
  }
  return uVar3;
}

Assistant:

static int
lws_token_from_index(struct lws *wsi, int index, const char **arg, int *len,
		     uint32_t *hdr_len)
{
	struct hpack_dynamic_table *dyn;

	if (index == LWS_HPACK_IGNORE_ENTRY)
		return LWS_HPACK_IGNORE_ENTRY;

	/* dynamic table only belongs to network wsi */
	wsi = lws_get_network_wsi(wsi);
	if (!wsi->h2.h2n)
		return -1;

	dyn = &wsi->h2.h2n->hpack_dyn_table;

	if (index < 0)
		return -1;

	if (index < (int)LWS_ARRAY_SIZE(static_token)) {
		if (arg && index < (int)LWS_ARRAY_SIZE(http2_canned)) {
			*arg = http2_canned[index];
			*len = (int)strlen(http2_canned[index]);
		}
		if (hdr_len)
			*hdr_len = static_hdr_len[index];

		return static_token[index];
	}

	if (!dyn) {
		lwsl_notice("no dynamic table\n");
		return -1;
	}

	if (index >= (int)LWS_ARRAY_SIZE(static_token) + dyn->used_entries) {
		lwsl_info("  %s: adjusted index %d >= %d\n", __func__, index,
				(int)LWS_ARRAY_SIZE(static_token) + dyn->used_entries);
		lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
			      "index out of range");
		return -1;
	}

	index -= (int)LWS_ARRAY_SIZE(static_token);
	index = (dyn->pos - 1 - index) % dyn->num_entries;
	if (index < 0)
		index += dyn->num_entries;

	lwsl_header("%s: dyn index %d, tok %d\n", __func__, index,
		    dyn->entries[index].lws_hdr_idx);

	if (arg && len) {
		*arg = dyn->entries[index].value;
		*len = dyn->entries[index].value_len;
	}

	if (hdr_len)
		*hdr_len = dyn->entries[index].hdr_len;

	return dyn->entries[index].lws_hdr_idx;
}